

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCreateTable(Btree *p,Pgno *piTable,int flags)

{
  int *piVar1;
  BtShared *pBt;
  uint uVar2;
  bool bVar3;
  u8 eType_00;
  Pgno iFreePage;
  uint uVar4;
  int iVar5;
  BtCursor *pBVar6;
  MemPage *pMVar7;
  int iVar8;
  uint nearby;
  long in_FS_OFFSET;
  u8 eType;
  MemPage *pPageMove;
  Pgno pgnoMove;
  int rc;
  Pgno pgnoRoot;
  MemPage *pRoot;
  int local_68;
  Pgno local_60;
  u8 local_59;
  MemPage *local_58;
  Pgno local_4c;
  int local_48;
  u32 local_44;
  MemPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBt = p->pBt;
  local_40 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
  local_44 = 0xaaaaaaaa;
  local_48 = -0x55555556;
  if (pBt->autoVacuum == '\0') {
    iVar8 = allocateBtreePage(pBt,&local_40,&local_44,1,'\0');
    local_48 = iVar8;
    if (iVar8 != 0) goto LAB_0014fea2;
  }
  else {
    local_4c = 0xaaaaaaaa;
    local_58 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
    for (pBVar6 = pBt->pCursor; pBVar6 != (BtCursor *)0x0; pBVar6 = pBVar6->pNext) {
      pBVar6->curFlags = pBVar6->curFlags & 0xfb;
    }
    sqlite3BtreeGetMeta(p,4,&local_44);
    if (pBt->nPage < local_44) {
      bVar3 = false;
      iVar8 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13b8b,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    }
    else {
      do {
        uVar2 = local_44;
        nearby = uVar2 + 1;
        uVar4 = 0;
        if (1 < nearby) {
          iVar8 = (uVar2 - 1) - (uVar2 - 1) % (pBt->usableSize / 5 + 1);
          uVar4 = iVar8 + (uint)(iVar8 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
        }
        local_44 = nearby;
      } while ((nearby == uVar4) || (uVar2 == (uint)sqlite3PendingByte / pBt->pageSize));
      iVar8 = allocateBtreePage(pBt,&local_58,&local_4c,nearby,'\x01');
      iFreePage = local_4c;
      local_48 = iVar8;
      if (iVar8 == 0) {
        if (local_4c == nearby) {
          local_40 = local_58;
          iVar8 = local_68;
        }
        else {
          local_59 = '\0';
          local_60 = 0;
          if (pBt->pCursor == (BtCursor *)0x0) {
            iVar5 = 0;
          }
          else {
            iVar5 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0);
          }
          local_48 = iVar5;
          if (local_58 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(local_58->pDbPage);
          }
          if ((iVar5 == 0) &&
             (local_48 = btreeGetPage(pBt,nearby,&local_40,0), iVar5 = local_48, local_48 == 0)) {
            local_48 = ptrmapGet(pBt,nearby,&local_59,&local_60);
            eType_00 = local_59;
            if ((byte)(local_59 - 1) < 2) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13bbb,
                          "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
              local_48 = 0xb;
            }
            pMVar7 = local_40;
            if (local_48 != 0) {
LAB_00150025:
              iVar5 = local_48;
              if (pMVar7 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
              }
              goto LAB_0014ff4f;
            }
            iVar8 = relocatePage(pBt,local_40,eType_00,local_60,iFreePage,0);
            local_48 = iVar8;
            if (pMVar7 != (MemPage *)0x0) {
              sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
            }
            iVar5 = iVar8;
            if ((iVar8 != 0) ||
               (local_48 = btreeGetPage(pBt,nearby,&local_40,0), pMVar7 = local_40, iVar5 = local_48
               , local_48 != 0)) goto LAB_0014ff4f;
            local_48 = sqlite3PagerWrite(local_40->pDbPage);
            if (local_48 != 0) goto LAB_00150025;
            bVar3 = true;
          }
          else {
LAB_0014ff4f:
            iVar8 = iVar5;
            bVar3 = false;
          }
          if (!bVar3) goto LAB_0014fe6b;
        }
        ptrmapPut(pBt,nearby,'\x01',0,&local_48);
        if ((local_48 == 0) && (local_48 = sqlite3BtreeUpdateMeta(p,4,nearby), local_48 == 0)) {
          bVar3 = true;
          goto LAB_0014fe6e;
        }
        iVar8 = local_48;
        if (local_40 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_40->pDbPage);
        }
      }
LAB_0014fe6b:
      bVar3 = false;
    }
LAB_0014fe6e:
    if (!bVar3) goto LAB_0014fea2;
  }
  pMVar7 = local_40;
  zeroPage(local_40,(flags & 1U) * 3 + 10);
  if (pMVar7->pDbPage != (DbPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
  }
  *piTable = local_44;
  iVar8 = 0;
LAB_0014fea2:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, Pgno *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}